

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O1

void load1(char *filename)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  Am_Value *pAVar8;
  char *pcVar9;
  int iVar10;
  Am_Value_List l3;
  Am_Value_List l2;
  Am_Value_List l4;
  Am_Value_List l1;
  ifstream in_file;
  Am_Value AStack_298;
  Am_Value local_288;
  Am_String local_278 [8];
  Am_String local_270 [8];
  Am_Value local_268;
  Am_Value local_258;
  Am_Value_List local_248 [16];
  Am_Value_List local_238 [16];
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,filename,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"open failed",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    goto LAB_00104321;
  }
  Am_Load_Save_Context::Reset();
  Am_Load_Save_Context::Load((istream *)&local_288);
  Am_Value_List::Am_Value_List(local_248,&local_288);
  Am_Value::~Am_Value(&local_288);
  Am_Load_Save_Context::Load((istream *)&AStack_298);
  Am_Value_List::Am_Value_List((Am_Value_List *)&local_288,&AStack_298);
  Am_Value::~Am_Value(&AStack_298);
  Am_Load_Save_Context::Load((istream *)&local_258);
  Am_Value_List::Am_Value_List((Am_Value_List *)&AStack_298,&local_258);
  Am_Value::~Am_Value(&local_258);
  Am_Load_Save_Context::Load((istream *)&local_268);
  Am_Value_List::Am_Value_List((Am_Value_List *)&local_258,&local_268);
  Am_Value::~Am_Value(&local_268);
  pAVar8 = (Am_Value *)Am_Value_List::Get_Nth((int)local_248);
  iVar6 = Am_Value::operator_cast_to_int(pAVar8);
  if (iVar6 == 5) {
    pAVar8 = (Am_Value *)Am_Value_List::Get_Nth((int)local_248);
    Am_String::Am_String(local_270,pAVar8);
    cVar4 = Am_String::operator==(local_270,"hello");
    if (cVar4 == '\0') goto LAB_00104257;
    pAVar8 = (Am_Value *)Am_Value_List::Get_Nth((int)local_248);
    iVar7 = Am_Value::operator_cast_to_int(pAVar8);
    if (iVar7 != 10) goto LAB_00104257;
    cVar4 = Am_Value_List::operator==(local_248,(Am_Value_List *)&local_288);
    if (cVar4 == '\0') goto LAB_00104257;
    iVar10 = (int)&AStack_298;
    pAVar8 = (Am_Value *)Am_Value_List::Get_Nth(iVar10);
    iVar7 = Am_Value::operator_cast_to_int(pAVar8);
    if (iVar7 != 5) goto LAB_00104257;
    pAVar8 = (Am_Value *)Am_Value_List::Get_Nth(iVar10);
    Am_String::Am_String(local_278,pAVar8);
    cVar4 = Am_String::operator==(local_278,"hello");
    bVar3 = true;
    if (cVar4 == '\0') goto LAB_0010425a;
    pAVar8 = (Am_Value *)Am_Value_List::Get_Nth(iVar10);
    iVar7 = Am_Value::operator_cast_to_int(pAVar8);
    if (iVar7 != 10) goto LAB_0010425a;
    pAVar8 = (Am_Value *)Am_Value_List::Get_Nth(iVar10);
    Am_Value_List::Am_Value_List((Am_Value_List *)&local_268,pAVar8);
    cVar4 = Am_Value_List::operator==((Am_Value_List *)&local_268,local_248);
    if (cVar4 == '\0') {
      bVar3 = true;
      bVar2 = true;
      goto LAB_0010425f;
    }
    pAVar8 = (Am_Value *)Am_Value_List::Get_Nth(iVar10);
    Am_Value_List::Am_Value_List(local_238,pAVar8);
    cVar4 = Am_Value_List::operator==(local_238,(Am_Value_List *)&local_288);
    bVar3 = true;
    if (cVar4 == '\0') {
      bVar5 = 0;
    }
    else {
      bVar5 = Am_Value_List::operator==
                        ((Am_Value_List *)&local_258,(Am_Value_List *)&Am_No_Value_List);
    }
    bVar2 = true;
    bVar1 = true;
  }
  else {
LAB_00104257:
    bVar3 = false;
LAB_0010425a:
    bVar2 = false;
LAB_0010425f:
    bVar1 = false;
    bVar5 = 0;
  }
  if (bVar1) {
    Am_Value_List::~Am_Value_List(local_238);
  }
  if (bVar2) {
    Am_Value_List::~Am_Value_List((Am_Value_List *)&local_268);
  }
  if (bVar3) {
    Am_String::~Am_String(local_278);
  }
  if (iVar6 == 5) {
    Am_String::~Am_String(local_270);
  }
  pcVar9 = "Test 1 failed";
  if (bVar5 != 0) {
    pcVar9 = "Test 1 okay";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar9,(ulong)(bVar5 ^ 1) * 2 + 0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_258);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&AStack_298);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_288);
  Am_Value_List::~Am_Value_List(local_248);
LAB_00104321:
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void
load1(const char *filename)
{
  // open input-file
  std::ifstream in_file(filename, std::ios::in);
  if (!in_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // read-in the different Am_Value_List objects
  Am_Value_List l1 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l2 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l3 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l4 = Am_Default_Load_Save_Context.Load(in_file);

  if ((int)l1.Get_Nth(0) == 5 && Am_String(l1.Get_Nth(1)) == "hello" &&
      (int)l1.Get_Nth(2) == 10 && l1 == l2 && (int)l3.Get_Nth(0) == 5 &&
      Am_String(l3.Get_Nth(1)) == "hello" && (int)l3.Get_Nth(2) == 10 &&
      Am_Value_List(l3.Get_Nth(3)) == l1 &&
      Am_Value_List(l3.Get_Nth(4)) == l2 && l4 == Am_No_Value_List) {
    std::cout << "Test 1 okay" << std::endl;
  } else {
    std::cout << "Test 1 failed" << std::endl;
  }

  return;
}